

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Vector<LLVMBC::BasicBlock_*> * __thiscall
dxil_spv::Converter::Impl::build_function_bb_visit_order_analysis
          (Vector<LLVMBC::BasicBlock_*> *__return_storage_ptr__,Impl *this,Function *func)

{
  BasicBlock *bb;
  UnorderedSet<LLVMBC::BasicBlock_*> visited;
  _Hashtable<LLVMBC::BasicBlock_*,_LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<LLVMBC::BasicBlock_*>,_std::hash<LLVMBC::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_50;
  
  if (func == (Function *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_50._M_buckets = &local_50._M_single_bucket;
    local_50._M_bucket_count = 1;
    local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_50._M_element_count = 0;
    local_50._M_rehash_policy._M_max_load_factor = 1.0;
    local_50._M_rehash_policy._M_next_resize = 0;
    local_50._M_single_bucket = (__node_base_ptr)0x0;
    (__return_storage_ptr__->
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bb = LLVMBC::Function::getEntryBlock(func);
    build_function_bb_visit_order_inner_analysis
              (this,__return_storage_ptr__,(UnorderedSet<LLVMBC::BasicBlock_*> *)&local_50,bb);
    std::
    __reverse<__gnu_cxx::__normal_iterator<LLVMBC::BasicBlock**,std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>>>
              ((__return_storage_ptr__->
               super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    std::
    _Hashtable<LLVMBC::BasicBlock_*,_LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<LLVMBC::BasicBlock_*>,_std::hash<LLVMBC::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<llvm::BasicBlock *> Converter::Impl::build_function_bb_visit_order_analysis(llvm::Function *func)
{
	if (!func)
		return {};

	UnorderedSet<llvm::BasicBlock *> visited;
	Vector<llvm::BasicBlock *> visit_order;
	auto *entry = &func->getEntryBlock();
	build_function_bb_visit_order_inner_analysis(visit_order, visited, entry);
	// Get natural traverse order, input is post-traversal order.
	std::reverse(visit_order.begin(), visit_order.end());
	return visit_order;
}